

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::KHRDebug::APIErrorsTest::iterate(APIErrorsTest *this)

{
  ostringstream *poVar1;
  GLboolean GVar2;
  GLenum GVar3;
  int iVar4;
  deUint32 dVar5;
  GLsync p_Var6;
  TestError *pTVar7;
  GLuint GVar8;
  EVP_PKEY_CTX *in_RSI;
  GLsync p_Var9;
  GLenum ids_1 [4];
  GLint max_length;
  GLint max_groups;
  GLint max_label;
  GLchar messageLog [32];
  GLsizei lengths [4];
  GLenum types [4];
  GLenum severities [4];
  vector<char,_std::allocator<char>_> too_long_message;
  vector<char,_std::allocator<char>_> too_long_label;
  undefined1 local_1e8 [120];
  ios_base local_170 [264];
  GLenum sources [4];
  Enum<int,_2UL> local_50;
  Enum<int,_2UL> local_40;
  
  TestBase::init(&this->super_TestBase,in_RSI);
  max_label = 0;
  (*((this->super_TestBase).m_gl)->getIntegerv)(0x82e8,&max_label);
  GVar3 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0xfb);
  too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize(&too_long_label,(long)(max_label + 2));
  if (-1 < max_label) {
    iVar4 = 0;
    do {
      too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start[iVar4] = 'f';
      iVar4 = iVar4 + 1;
    } while (iVar4 <= max_label);
  }
  too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(long)max_label + 1] = '\0';
  max_length = 0;
  (*((this->super_TestBase).m_gl)->getIntegerv)(0x9143,&max_length);
  GVar3 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x10d);
  too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize(&too_long_message,(long)(max_length + 2));
  if (-1 < max_length) {
    iVar4 = 0;
    do {
      too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar4] = 'f';
      iVar4 = iVar4 + 1;
    } while (iVar4 <= max_length);
  }
  too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(long)max_length + 1] = '\0';
  max_groups = 0;
  (*((this->super_TestBase).m_gl)->getIntegerv)(0x826c,&max_groups);
  GVar3 = (*((this->super_TestBase).m_gl)->getError)();
  glu::checkError(GVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                  ,0x11f);
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8892,0x824c,0x9148,0,(GLuint *)0x0,'\x01')
  ;
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x500) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x133);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DebugMessageControl with <source> set to GL_ARRAY_BUFFER",0x38);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x133);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x8892,0x9148,0,(GLuint *)0x0,'\x01')
  ;
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x500) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x138);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DebugMessageControl with <type> set to GL_ARRAY_BUFFER",0x36);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x138);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x824c,0x8892,0,(GLuint *)0x0,'\x01')
  ;
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x500) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x13c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DebugMessageControl with <severity> set to GL_ARRAY_BUFFER",0x3a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x13c);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x824c,0x9148,-1,iterate::ids,'\x01')
  ;
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x501) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x141);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x501;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DebugMessageControl with <count> set to -1",0x2a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x141);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x1100,0x824c,0x1100,9,iterate::ids,'\x01');
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x502) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x145);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x502;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "DebugMessageControl with <source> set to GL_DONT_CARE and non zero <count>",0x4a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x145);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x1100,0x1100,9,iterate::ids,'\x01');
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x502) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x149);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x502;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "DebugMessageControl with <type> set to GL_DONT_CARE and non zero <count>",0x48);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x149);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageControl)(0x8246,0x824c,0x9148,9,iterate::ids,'\x01');
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x502) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x14f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x502;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "DebugMessageControl with <severity> set to GL_DEBUG_SEVERITY_LOW and non zero <count>"
               ,0x55);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x14f);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->getDebugMessageLog)
            (4,-1,sources,types,ids_1,severities,lengths,messageLog);
  local_40.m_value = (*((this->super_TestBase).m_gl)->getError)();
  if (local_40.m_value != 0x501) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x163);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    local_40.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_40,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    local_50.m_getName = glu::getErrorName;
    local_50.m_value = 0x501;
    tcu::Format::Enum<int,_2UL>::toStream(&local_50,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GetDebugMessageLog with <bufSize> set to -1",0x2b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x163);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageInsert)(0x8246,0x824d,0,0x9148,4,"Foo");
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x500) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x176);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DebugMessageInsert with <source> set to GL_DEBUG_SOURCE_API",0x3b)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x176);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageInsert)(0x824a,0x8892,0,0x9148,4,"Foo");
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x500) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x17a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DebugMessageInsert with <type> set to GL_ARRAY_BUFFER",0x35);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x17a);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageInsert)(0x824a,0x824d,0,0x8892,4,"Foo");
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x500) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x17f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DebugMessageInsert with <severity> set to GL_ARRAY_BUFFER",0x39);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x17f);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageInsert)(0x824a,0x824d,0,0x9148,max_length + 1,"Foo");
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x501) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x184);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x501;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "DebugMessageInsert with <length> set to GL_MAX_DEBUG_MESSAGE_LENGTH + 1",0x47);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x184);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->debugMessageInsert)
            (0x824a,0x824d,0,0x9148,-1,
             too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x501) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x189);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x501;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DebugMessageInsert with too long message",0x28);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x189);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->pushDebugGroup)(0x8246,1,4,"Foo");
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ != 0x500) {
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x199);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    messageLog._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    ids_1._0_8_ = glu::getErrorName;
    ids_1[2] = 0x500;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"PushDebugGroup with <source> set to GL_DEBUG_SOURCE_API",0x37);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x199);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*((this->super_TestBase).m_gl)->pushDebugGroup)(0x824a,1,max_length + 1,"Foo");
  messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
  if (messageLog._8_4_ == 0x501) {
    (*((this->super_TestBase).m_gl)->pushDebugGroup)
              (0x824a,1,-1,
               too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
    if (messageLog._8_4_ != 0x501) {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
      std::ostream::operator<<(poVar1,0x1a1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Got wrong error: ",0x13);
      messageLog._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      ids_1._0_8_ = glu::getErrorName;
      ids_1[2] = 0x501;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"PushDebugGroup with too long message",0x24);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x1a1);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    cleanGroupStack((this->super_TestBase).m_gl);
    if (0 < max_groups + -1) {
      iVar4 = 0;
      do {
        (*((this->super_TestBase).m_gl)->pushDebugGroup)(0x824a,1,4,"Foo");
        dVar5 = (*((this->super_TestBase).m_gl)->getError)();
        glu::checkError(dVar5,"PushDebugGroup",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        ,0x1ab);
        iVar4 = iVar4 + 1;
      } while (iVar4 < max_groups + -1);
    }
    (*((this->super_TestBase).m_gl)->pushDebugGroup)(0x824a,1,4,"Foo");
    messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
    if (messageLog._8_4_ != 0x503) {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
      std::ostream::operator<<(poVar1,0x1b1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Got wrong error: ",0x13);
      messageLog._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      ids_1._0_8_ = glu::getErrorName;
      ids_1[2] = 0x503;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"PushDebugGroup called GL_MAX_DEBUG_GROUP_STACK_DEPTH times",0x3a
                );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x1b1);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    cleanGroupStack((this->super_TestBase).m_gl);
    fillGroupStack((this->super_TestBase).m_gl);
    if (0 < max_groups + -1) {
      iVar4 = 0;
      do {
        (*((this->super_TestBase).m_gl)->popDebugGroup)();
        dVar5 = (*((this->super_TestBase).m_gl)->getError)();
        glu::checkError(dVar5,"PopDebugGroup",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        ,0x1c2);
        iVar4 = iVar4 + 1;
      } while (iVar4 < max_groups + -1);
    }
    (*((this->super_TestBase).m_gl)->popDebugGroup)();
    messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
    if (messageLog._8_4_ != 0x504) {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
      std::ostream::operator<<(poVar1,0x1c6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Got wrong error: ",0x13);
      messageLog._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      ids_1._0_8_ = glu::getErrorName;
      ids_1[2] = 0x504;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"PopDebugGroup called GL_MAX_DEBUG_GROUP_STACK_DEPTH times",0x39)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x1c6);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    lengths._0_8_ = (ulong)(uint)lengths[1] << 0x20;
    (*((this->super_TestBase).m_gl)->genTextures)(1,(GLuint *)lengths);
    GVar3 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar3,"GenTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x1d8);
    (*((this->super_TestBase).m_gl)->objectLabel)(0x8c2a,lengths[0],4,"Foo");
    messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
    if (messageLog._8_4_ != 0x500) {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
      std::ostream::operator<<(poVar1,0x1de);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Got wrong error: ",0x13);
      messageLog._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      ids_1._0_8_ = glu::getErrorName;
      ids_1[2] = 0x500;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ObjectLabel with <identifier> set to GL_TEXTURE_BUFFER",0x36);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x1de);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    GVar8 = 1;
    while( true ) {
      GVar2 = (*((this->super_TestBase).m_gl)->isTexture)(GVar8);
      if (GVar2 != '\x01') break;
      GVar8 = GVar8 + 1;
    }
    (*((this->super_TestBase).m_gl)->objectLabel)(0x1702,GVar8,4,"Foo");
    messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
    if (messageLog._8_4_ != 0x501) {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
      std::ostream::operator<<(poVar1,0x1e7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Got wrong error: ",0x13);
      messageLog._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      ids_1._0_8_ = glu::getErrorName;
      ids_1[2] = 0x501;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ObjectLabel with <name> set to not generated value",0x32);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x1e7);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*((this->super_TestBase).m_gl)->objectLabel)(0x1702,lengths[0],max_label + 1,"Foo");
    messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
    if (messageLog._8_4_ != 0x501) {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
      std::ostream::operator<<(poVar1,0x1eb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Got wrong error: ",0x13);
      messageLog._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      ids_1._0_8_ = glu::getErrorName;
      ids_1[2] = 0x501;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ObjectLabel with <label> set to MAX_LABEL_LENGTH + 1",0x34);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x1eb);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*((this->super_TestBase).m_gl)->objectLabel)
              (0x1702,lengths[0],-1,
               too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
    if (messageLog._8_4_ != 0x501) {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
      std::ostream::operator<<(poVar1,0x1ef);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Got wrong error: ",0x13);
      messageLog._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      ids_1._0_8_ = glu::getErrorName;
      ids_1[2] = 0x501;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ObjectLabel with too long label",0x1f);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x1ef);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (*((this->super_TestBase).m_gl)->deleteTextures)(1,(GLuint *)lengths);
    types[0] = 0;
    severities[0] = 0;
    (*((this->super_TestBase).m_gl)->genTextures)(1,severities);
    (*((this->super_TestBase).m_gl)->bindTexture)(0xde1,severities[0]);
    GVar3 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar3,"GenTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x20b);
    (*((this->super_TestBase).m_gl)->getObjectLabel)
              (0x8c2a,severities[0],0x20,(GLsizei *)types,messageLog);
    ids_1[2] = (*((this->super_TestBase).m_gl)->getError)();
    if (ids_1[2] != 0x500) {
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
      std::ostream::operator<<(poVar1,0x211);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Got wrong error: ",0x13);
      ids_1._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      lengths._0_8_ = glu::getErrorName;
      lengths[2] = 0x500;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)lengths,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"GetObjectLabel with <identifier> set to GL_TEXTURE_BUFFER",0x39)
      ;
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x211);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    GVar8 = 1;
    while( true ) {
      GVar2 = (*((this->super_TestBase).m_gl)->isTexture)(GVar8);
      if (GVar2 != '\x01') break;
      GVar8 = GVar8 + 1;
    }
    (*((this->super_TestBase).m_gl)->getObjectLabel)(0x1702,GVar8,0x20,(GLsizei *)types,messageLog);
    ids_1[2] = (*((this->super_TestBase).m_gl)->getError)();
    if (ids_1[2] == 0x501) {
      (*((this->super_TestBase).m_gl)->getObjectLabel)(0x1702,GVar8,-1,(GLsizei *)types,messageLog);
      ids_1[2] = (*((this->super_TestBase).m_gl)->getError)();
      if (ids_1[2] != 0x501) {
        local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1e8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                   ,0x7e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
        std::ostream::operator<<(poVar1,0x21e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Got wrong error: ",0x13);
        ids_1._0_8_ = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
        lengths._0_8_ = glu::getErrorName;
        lengths[2] = 0x501;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)lengths,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"GetObjectLabel with <bufSize> set to -1",0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid error generated",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                   ,0x21e);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*((this->super_TestBase).m_gl)->deleteTextures)(1,severities);
      p_Var6 = (*((this->super_TestBase).m_gl)->fenceSync)(0x9117,0);
      GVar3 = (*((this->super_TestBase).m_gl)->getError)();
      glu::checkError(GVar3,"FenceSync",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                      ,0x236);
      p_Var9 = (GLsync)0x0;
      while( true ) {
        GVar2 = (*((this->super_TestBase).m_gl)->isSync)(p_Var9);
        if (GVar2 != '\x01') break;
        p_Var9 = p_Var9 + 1;
      }
      (*((this->super_TestBase).m_gl)->objectPtrLabel)(p_Var9,4,"Foo");
      messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
      if (messageLog._8_4_ != 0x501) {
        local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1e8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                   ,0x7e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
        std::ostream::operator<<(poVar1,0x240);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Got wrong error: ",0x13);
        messageLog._0_8_ = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
        ids_1._0_8_ = glu::getErrorName;
        ids_1[2] = 0x501;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ObjectPtrLabel with <ptr> set to not generated value",0x34);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid error generated",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                   ,0x240);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*((this->super_TestBase).m_gl)->objectPtrLabel)(p_Var6,max_label + 1,"Foo");
      messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
      if (messageLog._8_4_ != 0x501) {
        local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1e8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                   ,0x7e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
        std::ostream::operator<<(poVar1,0x243);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Got wrong error: ",0x13);
        messageLog._0_8_ = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
        ids_1._0_8_ = glu::getErrorName;
        ids_1[2] = 0x501;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"ObjectPtrLabel with <length> set to MAX_LABEL_LENGTH + 1",0x38
                  );
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid error generated",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                   ,0x243);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*((this->super_TestBase).m_gl)->objectPtrLabel)
                (p_Var6,-1,
                 too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
      if (messageLog._8_4_ == 0x501) {
        (*((this->super_TestBase).m_gl)->deleteSync)(p_Var6);
        types[0] = 0;
        p_Var6 = (*((this->super_TestBase).m_gl)->fenceSync)(0x9117,0);
        GVar3 = (*((this->super_TestBase).m_gl)->getError)();
        glu::checkError(GVar3,"FenceSync",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                        ,0x25f);
        p_Var9 = (GLsync)0x0;
        while( true ) {
          GVar2 = (*((this->super_TestBase).m_gl)->isSync)(p_Var9);
          if (GVar2 != '\x01') break;
          p_Var9 = p_Var9 + 1;
        }
        (*((this->super_TestBase).m_gl)->getObjectPtrLabel)(p_Var9,0x20,(GLsizei *)types,messageLog)
        ;
        ids_1[2] = (*((this->super_TestBase).m_gl)->getError)();
        if (ids_1[2] != 0x501) {
          local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1e8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                     ,0x7e);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
          std::ostream::operator<<(poVar1,0x26a);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,". Got wrong error: ",0x13);
          ids_1._0_8_ = glu::getErrorName;
          tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
          lengths._0_8_ = glu::getErrorName;
          lengths[2] = 0x501;
          tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)lengths,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"GetObjectPtrLabel with <ptr> set to not generated value",
                     0x37);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_170);
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"Invalid error generated",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                     ,0x26a);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*((this->super_TestBase).m_gl)->getObjectPtrLabel)(p_Var6,-1,(GLsizei *)types,messageLog);
        ids_1[2] = (*((this->super_TestBase).m_gl)->getError)();
        if (ids_1[2] != 0x501) {
          local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          poVar1 = (ostringstream *)(local_1e8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                     ,0x7e);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
          std::ostream::operator<<(poVar1,0x26d);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,". Got wrong error: ",0x13);
          ids_1._0_8_ = glu::getErrorName;
          tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
          lengths._0_8_ = glu::getErrorName;
          lengths[2] = 0x501;
          tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)lengths,(ostream *)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"GetObjectPtrLabel with <bufSize> set to -1",0x2a);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_170);
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"Invalid error generated",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                     ,0x26d);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*((this->super_TestBase).m_gl)->deleteSync)(p_Var6);
        lengths._0_8_ = types;
        (*((this->super_TestBase).m_gl)->getPointerv)(0x8892,(void **)lengths);
        messageLog._8_4_ = (*((this->super_TestBase).m_gl)->getError)();
        if (messageLog._8_4_ == 0x500) {
          tcu::TestContext::setTestResult
                    (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
          TestBase::done(&this->super_TestBase);
          if (too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(too_long_message.super__Vector_base<char,_std::allocator<char>_>._M_impl
                            .super__Vector_impl_data._M_start,
                            (long)too_long_message.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)too_long_message.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(too_long_label.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)too_long_label.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)too_long_label.super__Vector_base<char,_std::allocator<char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          return STOP;
        }
        local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1e8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                   ,0x7e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
        std::ostream::operator<<(poVar1,0x281);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Got wrong error: ",0x13);
        messageLog._0_8_ = glu::getErrorName;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
        ids_1._0_8_ = glu::getErrorName;
        ids_1[2] = 0x500;
        tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"GetPointerv with <pname> set to GL_ARRAY_BUFFER",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_170);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid error generated",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                   ,0x281);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1e8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x7e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
      std::ostream::operator<<(poVar1,0x246);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,". Got wrong error: ",0x13);
      messageLog._0_8_ = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
      ids_1._0_8_ = glu::getErrorName;
      ids_1[2] = 0x501;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"ObjectPtrLabel with too long label",0x22);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_170);
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Invalid error generated",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x246);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1e8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x7e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
    std::ostream::operator<<(poVar1,0x21a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13)
    ;
    ids_1._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
    lengths._0_8_ = glu::getErrorName;
    lengths[2] = 0x501;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)lengths,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GetObjectLabel with <name> set to not generated value",0x35);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_170);
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
               ,0x21a);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1e8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1e8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File: ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
             ,0x7e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", line: ",8);
  std::ostream::operator<<(poVar1,0x19d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". Got wrong error: ",0x13);
  messageLog._0_8_ = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)messageLog,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected: ",0xc);
  ids_1._0_8_ = glu::getErrorName;
  ids_1[2] = 0x501;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)ids_1,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", message: ",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"PushDebugGroup with <length> set to GL_MAX_DEBUG_MESSAGE_LENGTH + 1"
             ,0x43);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_170);
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
             ,0x19d);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult APIErrorsTest::iterate()
{
	/* Initialize rendering context */
	TestBase::init();

	/* Get maximum label length */
	GLint max_label = 0;

	m_gl->getIntegerv(GL_MAX_LABEL_LENGTH, &max_label);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetIntegerv");

	/* Prepare too long label */
	std::vector<GLchar> too_long_label;

	too_long_label.resize(max_label + 2);

	for (GLint i = 0; i <= max_label; ++i)
	{
		too_long_label[i] = 'f';
	}

	too_long_label[max_label + 1] = 0;

	/* Get maximum message length */
	GLint max_length = 0;

	m_gl->getIntegerv(GL_MAX_DEBUG_MESSAGE_LENGTH, &max_length);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetIntegerv");

	/* Prepare too long message */
	std::vector<GLchar> too_long_message;

	too_long_message.resize(max_length + 2);

	for (GLint i = 0; i <= max_length; ++i)
	{
		too_long_message[i] = 'f';
	}

	too_long_message[max_length + 1] = 0;

	/* Get maximum number of groups on stack */
	GLint max_groups = 0;

	m_gl->getIntegerv(GL_MAX_DEBUG_GROUP_STACK_DEPTH, &max_groups);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetIntegerv");

	/*
	 * DebugMessageControl function should generate:
	 * - INVALID_ENUM when <source> is invalid;
	 * - INVALID_ENUM when <type> is invalid;
	 * - INVALID_ENUM when <severity> is invalid;
	 * - INVALID_VALUE when <count> is negative;
	 * - INVALID_OPERATION when <count> is not zero and <source> is DONT_CARE;
	 * - INVALID_OPERATION when <count> is not zero and <type> is DONT_CARE;
	 * - INVALID_OPERATION when <count> is not zero and <severity> is not
	 * DONT_CARE.
	 */
	{
		static const GLuint  ids[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8 };
		static const GLsizei n_ids = (GLsizei)(sizeof(ids) / sizeof(ids[0]));

		m_gl->debugMessageControl(GL_ARRAY_BUFFER /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_DEBUG_SEVERITY_LOW /* severity */, 0 /* count */, 0 /* ids */,
								  GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageControl with <source> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_ARRAY_BUFFER /* type */,
								  GL_DEBUG_SEVERITY_LOW /* severity */, 0 /* count */, 0 /* ids */,
								  GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageControl with <type> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_ARRAY_BUFFER /* severity */, 0 /* count */, 0 /* ids */, GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageControl with <severity> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_DEBUG_SEVERITY_LOW /* severity */, -1 /* count */, ids /* ids */,
								  GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_VALUE, "DebugMessageControl with <count> set to -1");

		m_gl->debugMessageControl(GL_DONT_CARE /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_DONT_CARE /* severity */, n_ids /* count */, ids /* ids */, GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_OPERATION, "DebugMessageControl with <source> set to GL_DONT_CARE and non zero <count>");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_DONT_CARE /* type */,
								  GL_DONT_CARE /* severity */, n_ids /* count */, ids /* ids */, GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_OPERATION, "DebugMessageControl with <type> set to GL_DONT_CARE and non zero <count>");

		m_gl->debugMessageControl(GL_DEBUG_SOURCE_API /* source */, GL_DEBUG_TYPE_ERROR /* type */,
								  GL_DEBUG_SEVERITY_LOW /* severity */, n_ids /* count */, ids /* ids */,
								  GL_TRUE /* enabled */);
		CHECK_ERROR(GL_INVALID_OPERATION,
					"DebugMessageControl with <severity> set to GL_DEBUG_SEVERITY_LOW and non zero <count>");
	}

	/*
	 * GetDebugMessageLog function should generate:
	 * - INVALID_VALUE when <bufSize> is negative and messageLog is not NULL.
	 */
	{
		static const GLsizei bufSize = 32;
		static const GLuint  count   = 4;

		GLenum  ids[count];
		GLsizei lengths[count];
		GLchar  messageLog[bufSize];
		GLenum  types[count];
		GLenum  severities[count];
		GLenum  sources[count];

		m_gl->getDebugMessageLog(count /* count */, -1 /* bufSize */, sources, types, ids, severities, lengths,
								 messageLog);
		CHECK_ERROR(GL_INVALID_VALUE, "GetDebugMessageLog with <bufSize> set to -1");
	}

	/*
	 * DebugMessageInsert function should generate:
	 * - INVALID_ENUM when <source> is not DEBUG_SOURCE_APPLICATION or
	 * DEBUG_SOURCE_THIRD_PARTY;
	 * - INVALID_ENUM when <type> is invalid;
	 * - INVALID_ENUM when <severity> is invalid;
	 * - INVALID_VALUE when length of string <buf> is not less than
	 * MAX_DEBUG_MESSAGE_LENGTH.
	 */
	{
		static const GLchar  message[] = "Foo";
		static const GLsizei length	= (GLsizei)(sizeof(message) / sizeof(message[0]));

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_API /* source */, GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR /* type */,
								 0 /* id */, GL_DEBUG_SEVERITY_LOW /* severity */, length /* length */,
								 message /* message */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageInsert with <source> set to GL_DEBUG_SOURCE_API");

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_APPLICATION /* source */, GL_ARRAY_BUFFER /* type */, 0 /* id */,
								 GL_DEBUG_SEVERITY_LOW /* severity */, length /* length */, message /* message */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageInsert with <type> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_APPLICATION /* source */, GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR /* type */,
								 0 /* id */, GL_ARRAY_BUFFER /* severity */, length /* length */,
								 message /* message */);
		CHECK_ERROR(GL_INVALID_ENUM, "DebugMessageInsert with <severity> set to GL_ARRAY_BUFFER");

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_APPLICATION /* source */, GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR /* type */,
								 0 /* id */, GL_DEBUG_SEVERITY_LOW /* severity */, max_length + 1 /* length */,
								 message /* message */);
		CHECK_ERROR(GL_INVALID_VALUE, "DebugMessageInsert with <length> set to GL_MAX_DEBUG_MESSAGE_LENGTH + 1");

		m_gl->debugMessageInsert(GL_DEBUG_SOURCE_APPLICATION /* source */, GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR /* type */,
								 0 /* id */, GL_DEBUG_SEVERITY_LOW /* severity */, -1 /* length */,
								 &too_long_message[0] /* message */);
		CHECK_ERROR(GL_INVALID_VALUE, "DebugMessageInsert with too long message");
	}

	/*
	 * PushDebugGroup function should generate:
	 * - INVALID_ENUM when <source> is not DEBUG_SOURCE_APPLICATION or
	 * DEBUG_SOURCE_THIRD_PARTY;
	 * - INVALID_VALUE when length of string <message> is not less than
	 * MAX_DEBUG_MESSAGE_LENGTH;
	 * - STACK_OVERFLOW when stack contains MAX_DEBUG_GROUP_STACK_DEPTH entries.
	 */
	{
		static const GLchar  message[] = "Foo";
		static const GLsizei length	= (GLsizei)(sizeof(message) / sizeof(message[0]));

		m_gl->pushDebugGroup(GL_DEBUG_SOURCE_API /* source */, 1 /* id */, length /* length */, message /* message */);
		CHECK_ERROR(GL_INVALID_ENUM, "PushDebugGroup with <source> set to GL_DEBUG_SOURCE_API");

		m_gl->pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION /* source */, 1 /* id */, max_length + 1 /* length */,
							 message /* message */);
		CHECK_ERROR(GL_INVALID_VALUE, "PushDebugGroup with <length> set to GL_MAX_DEBUG_MESSAGE_LENGTH + 1");

		m_gl->pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION /* source */, 1 /* id */, -1 /* length */,
							 &too_long_message[0] /* message */);
		CHECK_ERROR(GL_INVALID_VALUE, "PushDebugGroup with too long message");

		/* Clean stack */
		cleanGroupStack(m_gl);

		/* Fill stack */
		for (GLint i = 0; i < max_groups - 1; ++i)
		{
			m_gl->pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION /* source */, 1 /* id */, length /* length */,
								 message /* message */);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "PushDebugGroup");
		}

		/* Overflow stack */
		m_gl->pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION /* source */, 1 /* id */, length /* length */,
							 message /* message */);
		CHECK_ERROR(GL_STACK_OVERFLOW, "PushDebugGroup called GL_MAX_DEBUG_GROUP_STACK_DEPTH times");

		/* Clean stack */
		cleanGroupStack(m_gl);
	}

	/*
	 * PopDebugGroup function should generate:
	 * - STACK_UNDERFLOW when stack contains no entries.
	 */
	{
		fillGroupStack(m_gl);

		for (GLint i = 0; i < max_groups - 1; ++i)
		{
			m_gl->popDebugGroup();

			GLU_EXPECT_NO_ERROR(m_gl->getError(), "PopDebugGroup");
		}

		m_gl->popDebugGroup();
		CHECK_ERROR(GL_STACK_UNDERFLOW, "PopDebugGroup called GL_MAX_DEBUG_GROUP_STACK_DEPTH times");
	}

	/*
	 * ObjectLabel function should generate:
	 * - INVALID_ENUM when <identifier> is invalid;
	 * - INVALID_VALUE when if <name> is not valid object name of type specified by
	 * <identifier>;
	 * - INVALID_VALUE when length of string <label> is not less than
	 * MAX_LABEL_LENGTH.
	 */
	{
		static const GLchar  label[] = "Foo";
		static const GLsizei length  = (GLsizei)(sizeof(label) / sizeof(label[0]));

		GLuint texture_id = 0;
		GLuint invalid_id = 1;
		m_gl->genTextures(1, &texture_id);
		GLU_EXPECT_NO_ERROR(m_gl->getError(), "GenTextures");

		try
		{
			m_gl->objectLabel(GL_TEXTURE_BUFFER /* identifier */, texture_id /* name */, length /* length */,
							  label /* label */);
			CHECK_ERROR(GL_INVALID_ENUM, "ObjectLabel with <identifier> set to GL_TEXTURE_BUFFER");

			while (GL_TRUE == m_gl->isTexture(invalid_id))
			{
				invalid_id += 1;
			}

			m_gl->objectLabel(GL_TEXTURE /* identifier */, invalid_id /* name */, length /* length */,
							  label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectLabel with <name> set to not generated value");

			m_gl->objectLabel(GL_TEXTURE /* identifier */, texture_id /* name */, max_label + 1 /* length */,
							  label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectLabel with <label> set to MAX_LABEL_LENGTH + 1");

			m_gl->objectLabel(GL_TEXTURE /* identifier */, texture_id /* name */, -1 /* length */,
							  &too_long_label[0] /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectLabel with too long label");
		}
		catch (const std::exception& exc)
		{
			m_gl->deleteTextures(1, &texture_id);
			TCU_FAIL(exc.what());
		}

		m_gl->deleteTextures(1, &texture_id);
	}

	/*
	 * GetObjectLabel function should generate:
	 * - INVALID_ENUM when <identifier> is invalid;
	 * - INVALID_VALUE when if <name> is not valid object name of type specified by
	 * <identifier>;
	 * - INVALID_VALUE when <bufSize> is negative.
	 */
	{
		static const GLsizei bufSize = 32;

		GLchar  label[bufSize];
		GLsizei length = 0;

		GLuint texture_id = 0;
		GLuint invalid_id = 1;
		m_gl->genTextures(1, &texture_id);
		m_gl->bindTexture(GL_TEXTURE_2D, texture_id);
		GLU_EXPECT_NO_ERROR(m_gl->getError(), "GenTextures");

		try
		{
			m_gl->getObjectLabel(GL_TEXTURE_BUFFER /* identifier */, texture_id /* name */, bufSize /* bufSize */,
								 &length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_ENUM, "GetObjectLabel with <identifier> set to GL_TEXTURE_BUFFER");

			while (GL_TRUE == m_gl->isTexture(invalid_id))
			{
				invalid_id += 1;
			}

			m_gl->getObjectLabel(GL_TEXTURE /* identifier */, invalid_id /* name */, bufSize /* bufSize */,
								 &length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "GetObjectLabel with <name> set to not generated value");

			m_gl->getObjectLabel(GL_TEXTURE /* identifier */, invalid_id /* name */, -1 /* bufSize */,
								 &length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "GetObjectLabel with <bufSize> set to -1");
		}
		catch (const std::exception& exc)
		{
			m_gl->deleteTextures(1, &texture_id);
			TCU_FAIL(exc.what());
		}

		m_gl->deleteTextures(1, &texture_id);
	}

	/*
	 * ObjectPtrLabel function should generate:
	 * - INVALID_VALUE when <ptr> is not the name of sync object;
	 * - INVALID_VALUE when length of string <label> is not less than
	 * MAX_LABEL_LENGTH.
	 */
	{
		static const GLchar  label[] = "Foo";
		static const GLsizei length  = (GLsizei)(sizeof(label) / sizeof(label[0]));

		GLsync sync_id	= 0;
		GLsync invalid_id = 0;
		sync_id			  = m_gl->fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
		GLU_EXPECT_NO_ERROR(m_gl->getError(), "FenceSync");

		try
		{
			while (GL_TRUE == m_gl->isSync(invalid_id))
			{
				invalid_id = (GLsync)(((unsigned long long)invalid_id) + 1);
			}

			m_gl->objectPtrLabel(invalid_id /* name */, length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectPtrLabel with <ptr> set to not generated value");

			m_gl->objectPtrLabel(sync_id /* name */, max_label + 1 /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectPtrLabel with <length> set to MAX_LABEL_LENGTH + 1");

			m_gl->objectPtrLabel(sync_id /* name */, -1 /* length */, &too_long_label[0] /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "ObjectPtrLabel with too long label");
		}
		catch (const std::exception& exc)
		{
			m_gl->deleteSync(sync_id);
			TCU_FAIL(exc.what());
		}

		m_gl->deleteSync(sync_id);
	}

	/*
	 * GetObjectPtrLabel function should generate:
	 * - INVALID_VALUE when <ptr> is not the name of sync object;
	 * - INVALID_VALUE when <bufSize> is negative.
	 */
	{
		static const GLsizei bufSize = 32;

		GLchar  label[bufSize];
		GLsizei length = 0;

		GLsync sync_id	= 0;
		GLsync invalid_id = 0;
		sync_id			  = m_gl->fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
		GLU_EXPECT_NO_ERROR(m_gl->getError(), "FenceSync");

		try
		{
			while (GL_TRUE == m_gl->isSync(invalid_id))
			{
				invalid_id = (GLsync)(((unsigned long long)invalid_id) + 1);
			}

			m_gl->getObjectPtrLabel(invalid_id /* name */, bufSize /* bufSize */, &length /* length */,
									label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "GetObjectPtrLabel with <ptr> set to not generated value");

			m_gl->getObjectPtrLabel(sync_id /* name */, -1 /* bufSize */, &length /* length */, label /* label */);
			CHECK_ERROR(GL_INVALID_VALUE, "GetObjectPtrLabel with <bufSize> set to -1");
		}
		catch (const std::exception& exc)
		{
			m_gl->deleteSync(sync_id);
			TCU_FAIL(exc.what());
		}

		m_gl->deleteSync(sync_id);
	}

	/*
	 * GetPointerv function should generate:
	 * - INVALID_ENUM when <pname> is invalid.
	 **/
	{
		GLuint  uint;
		GLuint* uint_ptr = &uint;

		m_gl->getPointerv(GL_ARRAY_BUFFER, (GLvoid**)&uint_ptr);
		CHECK_ERROR(GL_INVALID_ENUM, "GetPointerv with <pname> set to GL_ARRAY_BUFFER");
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	TestBase::done();

	return tcu::TestNode::STOP;
}